

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

bool __thiscall
QGraphicsItem::collidesWithItem(QGraphicsItem *this,QGraphicsItem *other,ItemSelectionMode mode)

{
  undefined1 *puVar1;
  bool bVar2;
  undefined1 uVar3;
  QGraphicsItemPrivate *pQVar5;
  ulong uVar6;
  QGraphicsItem *pQVar7;
  QGraphicsItem *pQVar8;
  long in_FS_OFFSET;
  QPainterPath otherShape;
  undefined1 local_40 [8];
  QGraphicsItem local_38;
  int iVar4;
  
  local_38.d_ptr.d = *(QGraphicsItemPrivate **)(in_FS_OFFSET + 0x28);
  if (other == this) {
    uVar3 = 1;
  }
  else if (other == (QGraphicsItem *)0x0) {
    uVar3 = 0;
  }
  else {
    if (((((this->d_ptr).d)->field_0x162 & 2) != 0) ||
       (uVar6 = *(ulong *)&((other->d_ptr).d)->field_0x160, ((uint)uVar6 >> 0x11 & 1) != 0)) {
      bVar2 = isAncestorOf(this,other);
      pQVar8 = this;
      if (bVar2) goto LAB_005779aa;
      pQVar5 = (this->d_ptr).d;
      do {
        pQVar8 = pQVar5->parent;
LAB_005779aa:
      } while ((pQVar8 != (QGraphicsItem *)0x0) &&
              (pQVar5 = (pQVar8->d_ptr).d, (*(ulong *)&pQVar5->field_0x160 & 0x1000000000) == 0));
      bVar2 = isAncestorOf(other,this);
      pQVar7 = other;
      if (bVar2) goto LAB_005779da;
      pQVar5 = (other->d_ptr).d;
      do {
        pQVar7 = pQVar5->parent;
LAB_005779da:
      } while ((pQVar7 != (QGraphicsItem *)0x0) &&
              (pQVar5 = (pQVar7->d_ptr).d, (*(ulong *)&pQVar5->field_0x160 & 0x1000000000) == 0));
      if (pQVar8 == pQVar7) {
        puVar1 = &((this->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x8000000;
        (*other->_vptr_QGraphicsItem[4])((QPainterPath *)local_40,other);
        pQVar8 = (QGraphicsItem *)(local_40 + 8);
        mapFromItem(pQVar8,this,(QPainterPath *)other);
        iVar4 = (*this->_vptr_QGraphicsItem[7])(this,pQVar8,(ulong)mode);
        uVar3 = (undefined1)iVar4;
        QPainterPath::~QPainterPath((QPainterPath *)pQVar8);
        QPainterPath::~QPainterPath((QPainterPath *)local_40);
        puVar1 = &((this->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfffffffff7ffffff;
        goto LAB_00577ad9;
      }
      uVar6 = *(ulong *)&((other->d_ptr).d)->field_0x160;
    }
    local_38._vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    if ((uVar6 & 0x800020000) == 0) {
      (*other->_vptr_QGraphicsItem[4])(local_40 + 8,other);
    }
    else {
      clipPath((QGraphicsItem *)(local_40 + 8));
    }
    mapFromItem((QGraphicsItem *)local_40,this,(QPainterPath *)other);
    iVar4 = (*this->_vptr_QGraphicsItem[7])(this,(QGraphicsItem *)local_40,(ulong)mode);
    uVar3 = (undefined1)iVar4;
    QPainterPath::~QPainterPath((QPainterPath *)local_40);
    QPainterPath::~QPainterPath((QPainterPath *)(local_40 + 8));
  }
LAB_00577ad9:
  if ((QGraphicsItemPrivate *)*(long *)(in_FS_OFFSET + 0x28) == local_38.d_ptr.d) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsItem::collidesWithItem(const QGraphicsItem *other, Qt::ItemSelectionMode mode) const
{
    if (other == this)
        return true;
    if (!other)
        return false;
    // The items share the same clip if their closest clipper is the same, or
    // if one clips the other.
    bool clips = (d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren);
    bool otherClips = (other->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren);
    if (clips || otherClips) {
        const QGraphicsItem *closestClipper = isAncestorOf(other) ? this : parentItem();
        while (closestClipper && !(closestClipper->flags() & ItemClipsChildrenToShape))
            closestClipper = closestClipper->parentItem();
        const QGraphicsItem *otherClosestClipper = other->isAncestorOf(this) ? other : other->parentItem();
        while (otherClosestClipper && !(otherClosestClipper->flags() & ItemClipsChildrenToShape))
            otherClosestClipper = otherClosestClipper->parentItem();
        if (closestClipper == otherClosestClipper) {
            d_ptr->localCollisionHack = 1;
            bool res = collidesWithPath(mapFromItem(other, other->shape()), mode);
            d_ptr->localCollisionHack = 0;
            return res;
        }
    }

    QPainterPath otherShape = other->isClipped() ? other->clipPath() : other->shape();
    return collidesWithPath(mapFromItem(other, otherShape), mode);
}